

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O0

DdNode * zddPortFromBddStep(DdManager *dd,DdNode *B,int expected)

{
  uint id_00;
  uint *puVar1;
  DdNode *pDVar2;
  DdNode *E;
  int local_70;
  uint local_6c;
  uint local_68;
  int level;
  int id;
  DdNode *Be;
  DdNode *Bt;
  DdNode *Breg;
  DdNode *e;
  DdNode *t;
  DdNode *prevZdd;
  DdNode *res;
  int expected_local;
  DdNode *B_local;
  DdManager *dd_local;
  
  if (B == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (B == dd->one) {
    if (expected < dd->sizeZ) {
      dd_local = (DdManager *)dd->univ[expected];
    }
    else {
      dd_local = (DdManager *)dd->one;
    }
  }
  else {
    puVar1 = (uint *)((ulong)B & 0xfffffffffffffffe);
    prevZdd = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
    if (prevZdd == (DdNode *)0x0) {
      if (((ulong)B & 1) == 0) {
        Be = *(DdNode **)(puVar1 + 4);
        _level = *(DdNode **)(puVar1 + 6);
      }
      else {
        Be = (DdNode *)(*(ulong *)(puVar1 + 4) ^ 1);
        _level = (DdNode *)(*(ulong *)(puVar1 + 6) ^ 1);
      }
      id_00 = *puVar1;
      if (id_00 == 0x7fffffff) {
        local_70 = 0x7fffffff;
      }
      else {
        local_70 = dd->perm[(int)id_00];
      }
      pDVar2 = zddPortFromBddStep(dd,Be,local_70 + 1);
      if (pDVar2 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        E = zddPortFromBddStep(dd,_level,local_70 + 1);
        if (E == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
          prevZdd = cuddZddGetNode(dd,id_00,pDVar2,E);
          if (prevZdd == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,pDVar2);
            Cudd_RecursiveDerefZdd(dd,E);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDerefZdd(dd,pDVar2);
            Cudd_RecursiveDerefZdd(dd,E);
            cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,prevZdd);
            while (local_68 = local_70 + -1, expected <= (int)local_68) {
              pDVar2 = cuddZddGetNode(dd,dd->invperm[(int)local_68],prevZdd,prevZdd);
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,prevZdd);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,prevZdd);
              prevZdd = pDVar2;
              local_70 = local_68;
            }
            *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) + -1;
            dd_local = (DdManager *)prevZdd;
          }
        }
      }
    }
    else {
      if (*puVar1 == 0x7fffffff) {
        local_6c = *puVar1;
      }
      else {
        local_6c = dd->perm[*puVar1];
      }
      if (expected < (int)local_6c) {
        *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) + 1;
        while (local_68 = local_6c - 1, expected <= (int)local_68) {
          pDVar2 = cuddZddGetNode(dd,dd->invperm[(int)local_68],prevZdd,prevZdd);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,prevZdd);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDerefZdd(dd,prevZdd);
          prevZdd = pDVar2;
          local_6c = local_68;
        }
        *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)prevZdd & 0xfffffffffffffffe) + 4) + -1;
      }
      dd_local = (DdManager *)prevZdd;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
zddPortFromBddStep(
  DdManager * dd,
  DdNode * B,
  int  expected)
{
    DdNode      *res, *prevZdd, *t, *e;
    DdNode      *Breg, *Bt, *Be;
    int         id, level;

    statLine(dd);
    /* Terminal cases. */
    if (B == Cudd_Not(DD_ONE(dd)))
        return(DD_ZERO(dd));
    if (B == DD_ONE(dd)) {
        if (expected >= dd->sizeZ) {
            return(DD_ONE(dd));
        } else {
            return(dd->univ[expected]);
        }
    }

    Breg = Cudd_Regular(B);

    /* Computed table look-up. */
    res = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
    if (res != NULL) {
        level = cuddI(dd,Breg->index);
        /* Adding DC vars. */
        if (expected < level) {
            /* Add suppressed variables. */
            cuddRef(res);
            for (level--; level >= expected; level--) {
                prevZdd = res;
                id = dd->invperm[level];
                res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
                if (res == NULL) {
                    Cudd_RecursiveDerefZdd(dd, prevZdd);
                    return(NULL);
                }
                cuddRef(res);
                Cudd_RecursiveDerefZdd(dd, prevZdd);
            }
            cuddDeref(res);
        }
        return(res);
    }   /* end of cache look-up */

    if (Cudd_IsComplement(B)) {
        Bt = Cudd_Not(cuddT(Breg));
        Be = Cudd_Not(cuddE(Breg));
    } else {
        Bt = cuddT(Breg);
        Be = cuddE(Breg);
    }

    id = Breg->index;
    level = cuddI(dd,id);
    t = zddPortFromBddStep(dd, Bt, level+1);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = zddPortFromBddStep(dd, Be, level+1);
    if (e == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        return(NULL);
    }
    cuddRef(e);
    res = cuddZddGetNode(dd, id, t, e);
    if (res == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        Cudd_RecursiveDerefZdd(dd, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDerefZdd(dd, t);
    Cudd_RecursiveDerefZdd(dd, e);

    cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,res);

    for (level--; level >= expected; level--) {
        prevZdd = res;
        id = dd->invperm[level];
        res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd, prevZdd);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd, prevZdd);
    }

    cuddDeref(res);
    return(res);

}